

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.c
# Opt level: O0

void log_packet(LogContext *ctx,int direction,int type,char *texttype,void *data,size_t len,
               int n_blanks,logblank_t *blanks,unsigned_long *seq,uint downstream_id,
               char *additional_log_text)

{
  char *pcVar1;
  bool bVar2;
  ptrlen data_00;
  char local_278;
  uint local_260;
  int local_25c;
  int c;
  int blktype;
  undefined1 local_220 [8];
  tm tm;
  char buf [256];
  int local_dc;
  long lStack_d8;
  int output_pos;
  size_t omitted;
  size_t b;
  size_t p;
  char local_b8 [3];
  char smalldata [5];
  char dumpdata [128];
  size_t len_local;
  void *data_local;
  char *texttype_local;
  int type_local;
  int direction_local;
  LogContext *ctx_local;
  
  b = 0;
  omitted = 0;
  lStack_d8 = 0;
  local_dc = 0;
  if ((ctx->logtype == 4) || ((ctx->logtype == 3 && (texttype != (char *)0x0)))) {
    if (texttype == (char *)0x0) {
      ltime();
      memcpy(local_220,&c,0x38);
      strftime((char *)&tm.tm_zone,0x18,"%Y-%m-%d %H:%M:%S",(tm *)local_220);
      pcVar1 = "Outgoing";
      if (direction == 0) {
        pcVar1 = "Incoming";
      }
      logprintf(ctx,"%s raw data at %s\r\n",pcVar1,&tm.tm_zone);
    }
    else {
      pcVar1 = "Outgoing";
      if (direction == 0) {
        pcVar1 = "Incoming";
      }
      logprintf(ctx,"%s packet ",pcVar1);
      if (seq != (unsigned_long *)0x0) {
        logprintf(ctx,"#0x%lx, ",*seq);
      }
      logprintf(ctx,"type %d / 0x%02x (%s)",(ulong)(uint)type,(ulong)(uint)type,texttype);
      if ((downstream_id != 0) &&
         (logprintf(ctx," on behalf of downstream #%u",(ulong)downstream_id),
         additional_log_text != (char *)0x0)) {
        logprintf(ctx," (%s)",additional_log_text);
      }
      logprintf(ctx,"\r\n");
    }
    while (b < len) {
      while( true ) {
        bVar2 = false;
        if (omitted < (ulong)(long)n_blanks) {
          bVar2 = (ulong)(long)(blanks[omitted].offset + blanks[omitted].len) <= b;
        }
        if (!bVar2) break;
        omitted = omitted + 1;
      }
      local_25c = 0;
      if (((omitted < (ulong)(long)n_blanks) && ((ulong)(long)blanks[omitted].offset <= b)) &&
         (b < (ulong)(long)(blanks[omitted].offset + blanks[omitted].len))) {
        local_25c = blanks[omitted].type;
      }
      if ((local_25c != 2) && (lStack_d8 != 0)) {
        pcVar1 = "s";
        if (lStack_d8 == 1) {
          pcVar1 = anon_var_dwarf_2471b + 10;
        }
        logprintf(ctx,"  (%zu byte%s omitted)\r\n",lStack_d8,pcVar1);
        lStack_d8 = 0;
      }
      if ((local_dc == 0) && (lStack_d8 == 0)) {
        sprintf(local_b8,"  %08zx%*s\r\n",b - (b & 0xf),0x43,anon_var_dwarf_2471b + 10);
      }
      if (local_25c == 2) {
        lStack_d8 = lStack_d8 + 1;
      }
      else {
        if (local_25c == 1) {
          local_260 = 0x58;
          sprintf((char *)((long)&p + 3),"XX");
        }
        else {
          local_260 = (uint)*(byte *)((long)data + b);
          sprintf((char *)((long)&p + 3),"%02x",(ulong)local_260);
        }
        dumpdata[(b & 0xf) * 3 + 4] = p._3_1_;
        dumpdata[(b & 0xf) * 3 + 5] = p._4_1_;
        if ((local_260 < 0x20) || (0x7e < local_260)) {
          local_278 = '.';
        }
        else {
          local_278 = (char)local_260;
        }
        dumpdata[(b & 0xf) + 0x35] = local_278;
        local_dc = ((uint)b & 0xf) + 1;
      }
      b = b + 1;
      if (((((b & 0xf) == 0) || (b == len)) || (lStack_d8 != 0)) && (local_dc != 0)) {
        strcpy(dumpdata + (long)local_dc + 0x35,"\r\n");
        data_00 = ptrlen_from_asciz(local_b8);
        logwrite(ctx,data_00);
        local_dc = 0;
      }
    }
    if (lStack_d8 != 0) {
      pcVar1 = "s";
      if (lStack_d8 == 1) {
        pcVar1 = anon_var_dwarf_2471b + 10;
      }
      logprintf(ctx,"  (%zu byte%s omitted)\r\n",lStack_d8,pcVar1);
    }
    logflush(ctx);
  }
  return;
}

Assistant:

void log_packet(LogContext *ctx, int direction, int type,
                const char *texttype, const void *data, size_t len,
                int n_blanks, const struct logblank_t *blanks,
                const unsigned long *seq,
                unsigned downstream_id, const char *additional_log_text)
{
    char dumpdata[128], smalldata[5];
    size_t p = 0, b = 0, omitted = 0;
    int output_pos = 0; /* NZ if pending output in dumpdata */

    if (!(ctx->logtype == LGTYP_SSHRAW ||
          (ctx->logtype == LGTYP_PACKETS && texttype)))
        return;

    /* Packet header. */
    if (texttype) {
        logprintf(ctx, "%s packet ",
                  direction == PKT_INCOMING ? "Incoming" : "Outgoing");

        if (seq)
            logprintf(ctx, "#0x%lx, ", *seq);

        logprintf(ctx, "type %d / 0x%02x (%s)", type, type, texttype);

        if (downstream_id) {
            logprintf(ctx, " on behalf of downstream #%u", downstream_id);
            if (additional_log_text)
                logprintf(ctx, " (%s)", additional_log_text);
        }

        logprintf(ctx, "\r\n");
    } else {
        /*
         * Raw data is logged with a timestamp, so that it's possible
         * to determine whether a mysterious delay occurred at the
         * client or server end. (Timestamping the raw data avoids
         * cluttering the normal case of only logging decrypted SSH
         * messages, and also adds conceptual rigour in the case where
         * an SSH message arrives in several pieces.)
         */
        char buf[256];
        struct tm tm;
        tm = ltime();
        strftime(buf, 24, "%Y-%m-%d %H:%M:%S", &tm);
        logprintf(ctx, "%s raw data at %s\r\n",
                  direction == PKT_INCOMING ? "Incoming" : "Outgoing",
                  buf);
    }

    /*
     * Output a hex/ASCII dump of the packet body, blanking/omitting
     * parts as specified.
     */
    while (p < len) {
        int blktype;

        /* Move to a current entry in the blanking array. */
        while ((b < n_blanks) &&
               (p >= blanks[b].offset + blanks[b].len))
            b++;
        /* Work out what type of blanking to apply to
         * this byte. */
        blktype = PKTLOG_EMIT; /* default */
        if ((b < n_blanks) &&
            (p >= blanks[b].offset) &&
            (p < blanks[b].offset + blanks[b].len))
            blktype = blanks[b].type;

        /* If we're about to stop omitting, it's time to say how
         * much we omitted. */
        if ((blktype != PKTLOG_OMIT) && omitted) {
            logprintf(ctx, "  (%"SIZEu" byte%s omitted)\r\n",
                      omitted, (omitted==1?"":"s"));
            omitted = 0;
        }

        /* (Re-)initialise dumpdata as necessary
         * (start of row, or if we've just stopped omitting) */
        if (!output_pos && !omitted)
            sprintf(dumpdata, "  %08"SIZEx"%*s\r\n",
                    p-(p%16), 1+3*16+2+16, "");

        /* Deal with the current byte. */
        if (blktype == PKTLOG_OMIT) {
            omitted++;
        } else {
            int c;
            if (blktype == PKTLOG_BLANK) {
                c = 'X';
                sprintf(smalldata, "XX");
            } else {  /* PKTLOG_EMIT */
                c = ((const unsigned char *)data)[p];
                sprintf(smalldata, "%02x", c);
            }
            dumpdata[10+2+3*(p%16)] = smalldata[0];
            dumpdata[10+2+3*(p%16)+1] = smalldata[1];
            dumpdata[10+1+3*16+2+(p%16)] = (c >= 0x20 && c < 0x7F ? c : '.');
            output_pos = (p%16) + 1;
        }

        p++;

        /* Flush row if necessary */
        if (((p % 16) == 0) || (p == len) || omitted) {
            if (output_pos) {
                strcpy(dumpdata + 10+1+3*16+2+output_pos, "\r\n");
                logwrite(ctx, ptrlen_from_asciz(dumpdata));
                output_pos = 0;
            }
        }

    }

    /* Tidy up */
    if (omitted)
        logprintf(ctx, "  (%"SIZEu" byte%s omitted)\r\n",
                  omitted, (omitted==1?"":"s"));
    logflush(ctx);
}